

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O2

void soul::HTMLGenerator::addMarkdownAsHTML
               (HTMLElement *parent,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *lines)

{
  pointer pLVar1;
  bool bVar2;
  long lVar3;
  HTMLElement *pHVar4;
  char *pcVar5;
  string *this;
  ulong uVar6;
  pointer pbVar7;
  string_view s;
  string_view markdown;
  string_view markdown_00;
  string_view value;
  string_view value_00;
  string_view text;
  string_view value_01;
  string_view text_00;
  string_view t;
  vector<ListLevel,_std::allocator<ListLevel>_> listStack;
  string type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> content;
  string trimmed;
  string local_1b8;
  _Any_data local_198;
  code *local_188;
  code *local_180;
  string local_178;
  CodeLocation local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paragraphs;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  groupMarkdownIntoParagraphs(&paragraphs,lines);
  listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar7 = paragraphs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar7 == paragraphs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::_Vector_base<ListLevel,_std::allocator<ListLevel>_>::~_Vector_base
                (&listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&paragraphs);
      return;
    }
    std::__cxx11::string::string((string *)&local_b0,(string *)pbVar7);
    choc::text::trimStart(&trimmed,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    uVar6 = pbVar7->_M_string_length - trimmed._M_string_length;
    bVar2 = isListMarker(&trimmed);
    if (bVar2) {
      uVar6 = uVar6 + 1;
      pLVar1 = listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>._M_impl.
               super__Vector_impl_data._M_finish;
      do {
        listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>._M_impl.
        super__Vector_impl_data._M_finish = pLVar1;
        pHVar4 = parent;
        if (listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>._M_impl.
            super__Vector_impl_data._M_start) goto LAB_0028c5ee;
        pLVar1 = listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
      } while (uVar6 < listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>._M_impl.
                       super__Vector_impl_data._M_finish[-1].indent);
      if (listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].indent < uVar6) {
        pHVar4 = listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].ul;
LAB_0028c5ee:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"ul",(allocator<char> *)&content);
        type._M_dataplus._M_p = (pointer)choc::html::HTMLElement::addChild(pHVar4,&local_50);
        type._M_string_length = uVar6;
        std::
        vector<soul::HTMLGenerator::addMarkdownAsHTML(choc::html::HTMLElement&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ListLevel,std::allocator<soul::HTMLGenerator::addMarkdownAsHTML(choc::html::HTMLElement&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ListLevel>>
        ::
        emplace_back<soul::HTMLGenerator::addMarkdownAsHTML(choc::html::HTMLElement&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ListLevel>
                  ((vector<soul::HTMLGenerator::addMarkdownAsHTML(choc::html::HTMLElement&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ListLevel,std::allocator<soul::HTMLGenerator::addMarkdownAsHTML(choc::html::HTMLElement&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::ListLevel>>
                    *)&listStack,(ListLevel *)&type);
        std::__cxx11::string::~string((string *)&local_50);
      }
      pHVar4 = listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].ul;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"li",(allocator<char> *)&content);
      pHVar4 = choc::html::HTMLElement::addChild(pHVar4,&local_d0);
      pcVar5 = (char *)0xffffffffffffffff;
      std::__cxx11::string::substr((ulong)&local_f0,(ulong)&trimmed);
      choc::text::trimStart(&type,&local_f0);
      markdown._M_str = pcVar5;
      markdown._M_len = (size_t)type._M_dataplus._M_p;
      appendSpansForContent((HTMLGenerator *)pHVar4,(HTMLElement *)type._M_string_length,markdown);
      std::__cxx11::string::~string((string *)&type);
      std::__cxx11::string::~string((string *)&local_f0);
      this = &local_d0;
LAB_0028c7e9:
      std::__cxx11::string::~string((string *)this);
    }
    else {
      if (listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>._M_impl.
          super__Vector_impl_data._M_start) {
        listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>._M_impl.
        super__Vector_impl_data._M_finish =
             listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      s._M_str = "```";
      s._M_len = 3;
      pcVar5 = "```";
      t._M_str = trimmed._M_dataplus._M_p;
      t._M_len = trimmed._M_string_length;
      bVar2 = choc::text::startsWith(t,s);
      if (bVar2) {
        lVar3 = std::__cxx11::string::find((char)&trimmed,10);
        if (lVar3 != -1) {
          std::__cxx11::string::substr((ulong)&local_70,(ulong)&trimmed);
          choc::text::trim(&type,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::substr((ulong)&content,(ulong)&trimmed);
          pHVar4 = parent;
          if (listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>._M_impl.
              super__Vector_impl_data._M_start !=
              listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pHVar4 = listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].ul;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_90,"code",(allocator<char> *)local_198._M_pod_data);
          pHVar4 = choc::html::HTMLElement::addChild(pHVar4,&local_90);
          pHVar4->contentIsInline = true;
          std::__cxx11::string::~string((string *)&local_90);
          bVar2 = std::operator==(&type,"soul");
          if (bVar2) {
            value._M_str = "hljs";
            value._M_len = 4;
            choc::html::HTMLElement::setClass(pHVar4,value);
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            local_178._M_string_length = 0;
            local_178.field_2._M_local_buf[0] = '\0';
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)content._M_dataplus._M_p == &content.field_2) {
              local_1b8.field_2._8_8_ = content.field_2._8_8_;
              local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
            }
            else {
              local_1b8._M_dataplus._M_p = content._M_dataplus._M_p;
            }
            local_1b8.field_2._M_allocated_capacity._1_7_ =
                 content.field_2._M_allocated_capacity._1_7_;
            local_1b8.field_2._M_local_buf[0] = content.field_2._M_local_buf[0];
            local_1b8._M_string_length = content._M_string_length;
            content._M_string_length = 0;
            content.field_2._M_local_buf[0] = '\0';
            content._M_dataplus._M_p = (pointer)&content.field_2;
            CodeLocation::createFromString(&local_158,&local_178,&local_1b8);
            local_198._8_8_ = 0;
            local_180 = std::
                        _Function_handler<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/documentation/soul_HTMLGeneration.cpp:802:67)>
                        ::_M_invoke;
            local_188 = std::
                        _Function_handler<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/documentation/soul_HTMLGeneration.cpp:802:67)>
                        ::_M_manager;
            local_198._M_unused._0_8_ = (undefined8)pHVar4;
            SourceCodeUtilities::iterateSyntaxTokens
                      (&local_158,
                       (function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                        *)&local_198);
            std::_Function_base::~_Function_base((_Function_base *)&local_198);
            RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_158.sourceCode);
            std::__cxx11::string::~string((string *)&local_1b8);
            std::__cxx11::string::~string((string *)&local_178);
          }
          else {
            value_01._M_str = "unspecified_code";
            value_01._M_len = 0x10;
            pHVar4 = choc::html::HTMLElement::setClass(pHVar4,value_01);
            text_00._M_str = content._M_dataplus._M_p;
            text_00._M_len = content._M_string_length;
            choc::html::HTMLElement::addContent(pHVar4,text_00);
          }
          std::__cxx11::string::~string((string *)&content);
          this = &type;
          goto LAB_0028c7e9;
        }
      }
      else {
        if (3 < uVar6) {
          pHVar4 = parent;
          if (listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>._M_impl.
              super__Vector_impl_data._M_start !=
              listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pHVar4 = listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].ul;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_110,"code",(allocator<char> *)&content);
          pHVar4 = choc::html::HTMLElement::addChild(pHVar4,&local_110);
          value_00._M_str = "unspecified_code";
          value_00._M_len = 0x10;
          pHVar4 = choc::html::HTMLElement::setClass(pHVar4,value_00);
          pHVar4->contentIsInline = true;
          std::__cxx11::string::string((string *)&local_130,(string *)pbVar7);
          choc::text::trimEnd(&type,&local_130);
          text._M_str = type._M_dataplus._M_p;
          text._M_len = type._M_string_length;
          choc::html::HTMLElement::addContent(pHVar4,text);
          std::__cxx11::string::~string((string *)&type);
          std::__cxx11::string::~string((string *)&local_130);
          this = &local_110;
          goto LAB_0028c7e9;
        }
        if (trimmed._M_string_length != 0) {
          pHVar4 = parent;
          if (listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>._M_impl.
              super__Vector_impl_data._M_start !=
              listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pHVar4 = listStack.super__Vector_base<ListLevel,_std::allocator<ListLevel>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].ul;
          }
          pHVar4 = choc::html::HTMLElement::addParagraph(pHVar4);
          markdown_00._M_str = pcVar5;
          markdown_00._M_len = (size_t)trimmed._M_dataplus._M_p;
          appendSpansForContent
                    ((HTMLGenerator *)pHVar4,(HTMLElement *)trimmed._M_string_length,markdown_00);
        }
      }
    }
    std::__cxx11::string::~string((string *)&trimmed);
    pbVar7 = pbVar7 + 1;
  } while( true );
}

Assistant:

static void addMarkdownAsHTML (choc::html::HTMLElement& parent, const std::vector<std::string>& lines)
    {
        auto paragraphs = groupMarkdownIntoParagraphs (lines);

        struct ListLevel
        {
            choc::html::HTMLElement& ul;
            size_t indent;
        };

        std::vector<ListLevel> listStack;

        auto getParent = [&] () -> choc::html::HTMLElement& { return listStack.empty() ? parent : listStack.back().ul; };

        for (auto& paragraph : paragraphs)
        {
            auto trimmed = choc::text::trimStart (paragraph);
            auto leadingSpaces = paragraph.length() - trimmed.length();

            if (isListMarker (trimmed))
            {
                auto indent = 1 + leadingSpaces;

                while (! listStack.empty() && listStack.back().indent > indent)
                    listStack.pop_back();

                if (listStack.empty() || listStack.back().indent < indent)
                    listStack.push_back ({ getParent().addChild ("ul"), indent });

                appendSpansForContent (listStack.back().ul.addChild ("li"),
                                       choc::text::trimStart (trimmed.substr (2)));
                continue;
            }

            listStack.clear();

            if (choc::text::startsWith (trimmed, "```"))
            {
                auto endOfLine1 = trimmed.find ('\n');

                if (endOfLine1 != std::string::npos)
                {
                    auto type = choc::text::trim (trimmed.substr (3, endOfLine1 - 3));

                    if (endOfLine1 < trimmed.length() - 1)
                        ++endOfLine1;

                    auto content = trimmed.substr (endOfLine1);
                    auto& code = getParent().addChild ("code").setInline (true);

                    if (type == "soul")
                    {
                        code.setClass ("hljs");

                        SourceCodeUtilities::iterateSyntaxTokens (CodeLocation::createFromString ({}, std::move (content)),
                                                                  [&] (std::string_view token, std::string_view cssClass) -> bool
                        {
                            if (cssClass.empty())
                                code.addContent (token);
                            else
                                code.addSpan (cssClass).addContent (token);

                            return true;
                        });
                    }
                    else
                    {
                        code.setClass ("unspecified_code").addContent (content);
                    }
                }

                continue;
            }

            if (leadingSpaces >= 4)
            {
                getParent().addChild ("code").setClass ("unspecified_code").setInline (true)
                    .addContent (choc::text::trimEnd (paragraph));

                continue;
            }

            if (! trimmed.empty())
                appendSpansForContent (getParent().addParagraph(), trimmed);
        }
    }